

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void FT_Request_Metrics(FT_Face face,FT_Size_Request req)

{
  FT_Size_Metrics *metrics;
  ushort uVar1;
  FT_Size_Request_Type FVar2;
  FT_Size pFVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long a_;
  long a__00;
  long b_;
  FT_Long FVar7;
  ulong uVar8;
  long lVar9;
  ulong b__00;
  int iVar10;
  
  pFVar3 = face->size;
  metrics = &pFVar3->metrics;
  if ((face->face_flags & 1) == 0) {
    (pFVar3->metrics).descender = 0;
    (pFVar3->metrics).height = 0;
    (pFVar3->metrics).y_scale = 0;
    (pFVar3->metrics).ascender = 0;
    (pFVar3->metrics).max_advance = 0;
    metrics->x_ppem = 0;
    metrics->y_ppem = 0;
    *(undefined4 *)&metrics->field_0x4 = 0;
    (pFVar3->metrics).x_scale = 0;
    (pFVar3->metrics).x_scale = 0x10000;
    (pFVar3->metrics).y_scale = 0x10000;
    return;
  }
  FVar2 = req->type;
  switch(FVar2) {
  case FT_SIZE_REQUEST_TYPE_NOMINAL:
    b__00 = (ulong)face->units_per_EM;
    uVar6 = b__00;
    goto LAB_001ebc0d;
  case FT_SIZE_REQUEST_TYPE_REAL_DIM:
    uVar6 = (long)face->ascender - (long)face->descender;
    uVar8 = uVar6;
    break;
  case FT_SIZE_REQUEST_TYPE_BBOX:
    uVar6 = (face->bbox).xMax - (face->bbox).xMin;
    uVar8 = (face->bbox).yMax - (face->bbox).yMin;
    break;
  case FT_SIZE_REQUEST_TYPE_CELL:
    uVar6 = (ulong)face->max_advance_width;
    uVar8 = (long)face->ascender - (long)face->descender;
    break;
  case FT_SIZE_REQUEST_TYPE_SCALES:
    lVar9 = req->width;
    (pFVar3->metrics).x_scale = lVar9;
    b_ = req->height;
    (pFVar3->metrics).y_scale = b_;
    if (lVar9 == 0) {
      (pFVar3->metrics).x_scale = b_;
      lVar9 = b_;
    }
    else if (b_ == 0) {
      (pFVar3->metrics).y_scale = lVar9;
      b_ = lVar9;
    }
    goto LAB_001ebd1e;
  default:
    b__00 = 0;
    uVar6 = 0;
    goto LAB_001ebc0d;
  }
  b__00 = -uVar6;
  if (0 < (long)uVar6) {
    b__00 = uVar6;
  }
  uVar6 = -uVar8;
  if (0 < (long)uVar8) {
    uVar6 = uVar8;
  }
LAB_001ebc0d:
  lVar9 = req->width;
  a_ = lVar9;
  if ((ulong)req->horiResolution != 0) {
    a_ = (long)((ulong)req->horiResolution * lVar9 + 0x24) / 0x48;
  }
  lVar4 = req->height;
  a__00 = lVar4;
  if ((ulong)req->vertResolution != 0) {
    a__00 = (long)((ulong)req->vertResolution * lVar4 + 0x24) / 0x48;
  }
  if (lVar9 == 0) {
    FVar7 = FT_DivFix(a__00,uVar6);
    (pFVar3->metrics).y_scale = FVar7;
    (pFVar3->metrics).x_scale = FVar7;
    a_ = FT_MulDiv(a__00,b__00,uVar6);
    b_ = FVar7;
LAB_001ebcff:
    iVar5 = (int)a__00;
    iVar10 = (int)a_;
    lVar9 = b_;
    b_ = FVar7;
    if (FVar2 == FT_SIZE_REQUEST_TYPE_NOMINAL) goto LAB_001ebd48;
  }
  else {
    b_ = FT_DivFix(a_,b__00);
    (pFVar3->metrics).x_scale = b_;
    if (lVar4 == 0) {
      (pFVar3->metrics).y_scale = b_;
      a__00 = FT_MulDiv(a_,uVar6,b__00);
      FVar7 = b_;
      goto LAB_001ebcff;
    }
    FVar7 = FT_DivFix(a__00,uVar6);
    (pFVar3->metrics).y_scale = FVar7;
    if (FVar2 != FT_SIZE_REQUEST_TYPE_CELL) goto LAB_001ebcff;
    if (b_ < FVar7) {
      (pFVar3->metrics).y_scale = b_;
      lVar9 = b_;
    }
    else {
      (pFVar3->metrics).x_scale = FVar7;
      lVar9 = FVar7;
      b_ = FVar7;
    }
  }
LAB_001ebd1e:
  uVar1 = face->units_per_EM;
  FVar7 = FT_MulFix((ulong)uVar1,lVar9);
  iVar10 = (int)FVar7;
  FVar7 = FT_MulFix((ulong)uVar1,b_);
  iVar5 = (int)FVar7;
LAB_001ebd48:
  (pFVar3->metrics).x_ppem = (FT_UShort)(iVar10 + 0x20U >> 6);
  (pFVar3->metrics).y_ppem = (FT_UShort)(iVar5 + 0x20U >> 6);
  ft_recompute_scaled_metrics(face,metrics);
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Request_Metrics( FT_Face          face,
                      FT_Size_Request  req )
  {
    FT_Size_Metrics*  metrics;


    metrics = &face->size->metrics;

    if ( FT_IS_SCALABLE( face ) )
    {
      FT_Long  w = 0, h = 0, scaled_w = 0, scaled_h = 0;


      switch ( req->type )
      {
      case FT_SIZE_REQUEST_TYPE_NOMINAL:
        w = h = face->units_per_EM;
        break;

      case FT_SIZE_REQUEST_TYPE_REAL_DIM:
        w = h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_BBOX:
        w = face->bbox.xMax - face->bbox.xMin;
        h = face->bbox.yMax - face->bbox.yMin;
        break;

      case FT_SIZE_REQUEST_TYPE_CELL:
        w = face->max_advance_width;
        h = face->ascender - face->descender;
        break;

      case FT_SIZE_REQUEST_TYPE_SCALES:
        metrics->x_scale = (FT_Fixed)req->width;
        metrics->y_scale = (FT_Fixed)req->height;
        if ( !metrics->x_scale )
          metrics->x_scale = metrics->y_scale;
        else if ( !metrics->y_scale )
          metrics->y_scale = metrics->x_scale;
        goto Calculate_Ppem;

      case FT_SIZE_REQUEST_TYPE_MAX:
        break;
      }

      /* to be on the safe side */
      if ( w < 0 )
        w = -w;

      if ( h < 0 )
        h = -h;

      scaled_w = FT_REQUEST_WIDTH ( req );
      scaled_h = FT_REQUEST_HEIGHT( req );

      /* determine scales */
      if ( req->width )
      {
        metrics->x_scale = FT_DivFix( scaled_w, w );

        if ( req->height )
        {
          metrics->y_scale = FT_DivFix( scaled_h, h );

          if ( req->type == FT_SIZE_REQUEST_TYPE_CELL )
          {
            if ( metrics->y_scale > metrics->x_scale )
              metrics->y_scale = metrics->x_scale;
            else
              metrics->x_scale = metrics->y_scale;
          }
        }
        else
        {
          metrics->y_scale = metrics->x_scale;
          scaled_h = FT_MulDiv( scaled_w, h, w );
        }
      }
      else
      {
        metrics->x_scale = metrics->y_scale = FT_DivFix( scaled_h, h );
        scaled_w = FT_MulDiv( scaled_h, w, h );
      }

  Calculate_Ppem:
      /* calculate the ppems */
      if ( req->type != FT_SIZE_REQUEST_TYPE_NOMINAL )
      {
        scaled_w = FT_MulFix( face->units_per_EM, metrics->x_scale );
        scaled_h = FT_MulFix( face->units_per_EM, metrics->y_scale );
      }

      metrics->x_ppem = (FT_UShort)( ( scaled_w + 32 ) >> 6 );
      metrics->y_ppem = (FT_UShort)( ( scaled_h + 32 ) >> 6 );

      ft_recompute_scaled_metrics( face, metrics );
    }
    else
    {
      FT_ZERO( metrics );
      metrics->x_scale = 1L << 16;
      metrics->y_scale = 1L << 16;
    }
  }